

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_GenSorter(char *pFileName,int nVars)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  if (1 < nVars) {
    __stream = fopen(pFileName,"w");
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"# %d-bit sorter generated by ABC on %s\n",(ulong)(uint)nVars,pcVar4);
    fprintf(__stream,".model Sorter%02d\n",(ulong)(uint)nVars);
    fwrite(".inputs",7,1,__stream);
    uVar5 = 0;
    do {
      fprintf(__stream," x%02d",uVar5);
      uVar8 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar8;
    } while (nVars != uVar8);
    fputc(10,__stream);
    fwrite(".outputs",8,1,__stream);
    uVar8 = 0;
    do {
      fprintf(__stream," y%02d",(ulong)uVar8);
      uVar8 = uVar8 + 1;
    } while (nVars != uVar8);
    fputc(10,__stream);
    uVar8 = (nVars + -2) * nVars;
    if (1 < uVar8) {
      uVar2 = uVar8 - 1;
      uVar8 = 0;
      do {
        uVar8 = uVar8 + 1;
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
    if (nVars == 2) {
      fwrite(".subckt Comp a=x00 b=x01 x=y00 y=y01\n",0x25,1,__stream);
    }
    else {
      fwrite(".subckt Layer0",0xe,1,__stream);
      uVar5 = 0;
      do {
        fprintf(__stream," x%02d=x%02d",uVar5,uVar5);
        uVar2 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar2;
      } while (nVars != uVar2);
      uVar5 = 0;
      do {
        uVar2 = (int)uVar5 + 1;
        fprintf(__stream," y%02d=%0*d",uVar5,(ulong)uVar8,uVar5);
        uVar5 = (ulong)uVar2;
      } while (nVars != uVar2);
      fputc(10,__stream);
      uVar3 = nVars * 2 - 2;
      uVar2 = 2;
      if (2 < (int)uVar3) {
        uVar2 = uVar3;
      }
      uVar3 = 1;
      iVar9 = 0;
      do {
        fprintf(__stream,".subckt Layer%d",(ulong)(uVar3 & 1));
        uVar6 = 0;
        do {
          fprintf(__stream," x%02d=%0*d",(ulong)uVar6,(ulong)uVar8,(ulong)(uVar6 + iVar9));
          uVar6 = uVar6 + 1;
        } while (nVars != uVar6);
        uVar6 = iVar9 + uVar6;
        uVar7 = 0;
        do {
          uVar5 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          fprintf(__stream," y%02d=%0*d",(ulong)uVar7,(ulong)uVar8,uVar5);
          uVar7 = uVar7 + 1;
        } while (uVar7 != nVars);
        fputc(10,__stream);
        uVar3 = uVar3 + 1;
        iVar9 = uVar6 - nVars;
      } while (uVar3 != uVar2);
      fprintf(__stream,".subckt Layer%d",0);
      uVar3 = 0;
      uVar2 = uVar6 - nVars;
      do {
        fprintf(__stream," x%02d=%0*d",(ulong)uVar3,(ulong)uVar8,(ulong)uVar2);
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + 1;
      } while (nVars != uVar3);
      uVar8 = 0;
      do {
        fprintf(__stream," y%02d=y%02d",(ulong)uVar8,(ulong)uVar8);
        uVar8 = uVar8 + 1;
      } while (nVars != uVar8);
      fputc(10,__stream);
    }
    fwrite(".end\n",5,1,__stream);
    fputc(10,__stream);
    Abc_WriteLayer((FILE *)__stream,nVars,0);
    Abc_WriteLayer((FILE *)__stream,nVars,1);
    Abc_WriteComp((FILE *)__stream);
    fclose(__stream);
    return;
  }
  __assert_fail("nVars > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                ,0x108,"void Abc_GenSorter(char *, int)");
}

Assistant:

void Abc_GenSorter( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k, Counter, nDigits;

    assert( nVars > 1 );

    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# %d-bit sorter generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model Sorter%02d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " x%02d", i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " y%02d", i );
    fprintf( pFile, "\n" );

    Counter = 0;
    nDigits = Abc_Base10Log( (nVars-2)*nVars );
    if ( nVars == 2 )
        fprintf( pFile, ".subckt Comp a=x00 b=x01 x=y00 y=y01\n" );
    else
    {
        fprintf( pFile, ".subckt Layer0" );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=x%02d", k, k );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
        fprintf( pFile, "\n" );
        Counter -= nVars;
        for ( i = 1; i < 2*nVars-2; i++ )
        {
            fprintf( pFile, ".subckt Layer%d", (i&1) );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
            fprintf( pFile, "\n" );
            Counter -= nVars;
        }
        fprintf( pFile, ".subckt Layer%d", (i&1) );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=y%02d", k, k );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );

    Abc_WriteLayer( pFile, nVars, 0 );
    Abc_WriteLayer( pFile, nVars, 1 );
    Abc_WriteComp( pFile );
    fclose( pFile );
}